

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

Expression * __thiscall
anon_unknown.dwarf_b296a::AssertionEmitter::translateInvoke
          (AssertionEmitter *this,InvokeAction *invoke,Module *wasm)

{
  bool bVar1;
  Export *this_00;
  Name *pNVar2;
  Function *this_01;
  Call *pCVar3;
  Iterator IVar4;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar5;
  Name NVar6;
  Name NVar7;
  Name local_d0;
  uintptr_t local_c0;
  Type type;
  Export *exp;
  Expression *local_88;
  value_type *local_80;
  value_type *arg;
  Iterator __end1;
  Iterator __begin1;
  Literals *__range1;
  Builder local_40;
  Builder builder;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Module *wasm_local;
  InvokeAction *invoke_local;
  AssertionEmitter *this_local;
  
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  ::wasm::Builder::Builder(&local_40,wasm);
  IVar4 = ::wasm::SmallVector<wasm::Literal,_1UL>::begin
                    ((SmallVector<wasm::Literal,_1UL> *)&invoke->args);
  __end1.
  super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  .index = (size_t)IVar4.
                   super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                   .parent;
  IVar5 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
           )::wasm::SmallVector<wasm::Literal,_1UL>::end
                      ((SmallVector<wasm::Literal,_1UL> *)&invoke->args);
  while( true ) {
    __end1.
    super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
    .parent = (SmallVector<wasm::Literal,_1UL> *)IVar5.index;
    arg = (value_type *)IVar5.parent;
    bVar1 = ::wasm::SmallVector<wasm::Literal,_1UL>::
            IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                          *)&__end1.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .index,(Iterator *)&arg);
    if (!bVar1) break;
    local_80 = ::wasm::SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                         ((Iterator *)
                          &__end1.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .index);
    ::wasm::Literal::Literal((Literal *)&exp,local_80);
    local_88 = ::wasm::Builder::makeConstantExpression(&local_40,(Literal *)&exp);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,&local_88
              );
    ::wasm::Literal::~Literal((Literal *)&exp);
    ::wasm::SmallVector<wasm::Literal,_1UL>::
    IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
    ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                  *)&__end1.
                     super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                     .index);
    IVar5.index = (size_t)__end1.
                          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                          .parent;
    IVar5.parent = (SmallVector<wasm::Literal,_1UL> *)arg;
  }
  type.id = (invoke->name).super_IString.str._M_len;
  NVar6.super_IString.str._M_str = (char *)type.id;
  NVar6.super_IString.str._M_len = (size_t)wasm;
  this_00 = (Export *)::wasm::Module::getExport(NVar6);
  if (this_00->kind == Function) {
    pNVar2 = ::wasm::Export::getInternalName(this_00);
    local_d0.super_IString.str._M_len = (pNVar2->super_IString).str._M_len;
    local_d0.super_IString.str._M_str = (pNVar2->super_IString).str._M_str;
  }
  else {
    ::wasm::Name::Name(&local_d0);
  }
  NVar7.super_IString.str._M_str = (char *)local_d0.super_IString.str._M_len;
  NVar7.super_IString.str._M_len = (size_t)wasm;
  this_01 = (Function *)::wasm::Module::getFunction(NVar7);
  local_c0 = (uintptr_t)::wasm::Function::getResults(this_01);
  pCVar3 = ::wasm::Builder::makeCall
                     (&local_40,(Name)(invoke->name).super_IString.str,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                      (Type)local_c0,false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  return (Expression *)pCVar3;
}

Assistant:

Expression* AssertionEmitter::translateInvoke(InvokeAction& invoke,
                                              Module& wasm) {
  std::vector<Expression*> args;
  Builder builder(wasm);
  for (auto& arg : invoke.args) {
    args.push_back(builder.makeConstantExpression(arg));
  }
  Export* exp = wasm.getExport(invoke.name);
  Type type = wasm
                .getFunction((exp->kind == ExternalKind::Function)
                               ? *exp->getInternalName()
                               : Name())
                ->getResults();
  return builder.makeCall(invoke.name, args, type);
}